

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O1

void helics::valueExtract
               (data_view *data,DataType baseType,
               vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val)

{
  pointer *ppcVar1;
  iterator __position;
  string_view val_00;
  uint *puVar2;
  data_view *data_00;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  string_view val_01;
  basic_string_view<char,_std::char_traits<char>_> val_1;
  undefined1 local_68 [32];
  double local_48 [2];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_38;
  
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(val,0);
  puVar2 = &switchD_0021bea1::switchdataD_003e842c;
  switch(baseType) {
  case HELICS_DOUBLE:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(double *)local_68);
    break;
  case HELICS_INT:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)local_68);
    local_68._0_8_ = (undefined8)(long)local_68._0_8_;
    break;
  case HELICS_COMPLEX:
    local_68._0_8_ = 0.0;
    local_68._8_8_ = 0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(complex<double> *)local_68);
    local_38.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
    local_38.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_68._8_8_;
    __position._M_current =
         (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      *(undefined8 *)(__position._M_current)->_M_value = local_68._0_8_;
      *(undefined8 *)((__position._M_current)->_M_value + 8) = local_68._8_8_;
      ppcVar1 = &(val->
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
      return;
    }
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    _M_realloc_insert<std::complex<double>const&>
              ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,__position,
               (complex<double> *)&local_38);
    return;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((vector<double,_std::allocator<double>_> *)local_68,data);
    uVar3 = local_68._8_8_ - local_68._0_8_;
    if (uVar3 != 8) {
      lVar4 = 8;
      uVar5 = 0;
      do {
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double&,double&>
                  ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,
                   (double *)((undefined1 *)(local_68._0_8_ + lVar4) + -8),
                   (double *)(local_68._0_8_ + lVar4));
        uVar5 = uVar5 + 2;
        uVar3 = local_68._8_8_ - local_68._0_8_;
        lVar4 = lVar4 + 0x10;
      } while (uVar5 < ((long)uVar3 >> 3) - 1U);
    }
    if ((uVar3 & 8) != 0) {
      local_38.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double&,double>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,
                 (double *)(local_68._8_8_ + -8),(double *)&local_38);
    }
    if ((double)local_68._0_8_ == 0.0) {
      return;
    }
    uVar3 = local_68._16_8_ - local_68._0_8_;
    goto LAB_0021c0e7;
  case HELICS_COMPLEX_VECTOR:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,val);
    return;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)local_68,data);
    if (NAN(local_48[0])) {
      val_01._M_str = (char *)puVar2;
      val_01._M_len = local_68._0_8_;
      helicsGetComplexVector(&local_38,(helics *)local_68._8_8_,val_01);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::_M_move_assign
                (val,&local_38);
      if (local_38.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      local_38.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double&,double>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,local_48,
                 (double *)&local_38);
    }
    if (local_68._0_8_ == (long)local_68 + 0x10) {
      return;
    }
    uVar3 = local_68._16_8_ + 1;
LAB_0021c0e7:
    operator_delete((void *)local_68._0_8_,uVar3);
    return;
  case HELICS_TIME:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)local_68);
    local_68._0_8_ =
         (double)((long)local_68._0_8_ % 1000000000) * 1e-09 +
         (double)((long)local_68._0_8_ / 1000000000);
    break;
  default:
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)local_68,(helics *)data,data_00);
      valueExtract((defV *)local_68,val);
      std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)local_68);
      return;
    }
  case HELICS_BOOL:
    local_68._0_8_ = 0.0;
    local_68._8_8_ = (char *)0x0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(string_view *)local_68);
    val_00._M_str = (char *)local_68._8_8_;
    val_00._M_len = local_68._0_8_;
    helicsGetComplexVector(val_00,val);
    return;
  }
  local_38.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  emplace_back<double,double>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,
             (double *)local_68,(double *)&local_38);
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, std::vector<std::complex<double>>& val)
{
    val.resize(0);
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            val.emplace_back(ValueConverter<double>::interpret(data), 0.0);
            break;
        }
        case DataType::HELICS_INT: {
            val.emplace_back(static_cast<double>(ValueConverter<int64_t>::interpret(data)), 0.0);
            break;
        }
        case DataType::HELICS_TIME: {
            const Time time(ValueConverter<int64_t>::interpret(data), time_units::ns);
            val.emplace_back(static_cast<double>(time), 0.0);
        } break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            helicsGetComplexVector(ValueConverter<std::string_view>::interpret(data), val);
            break;
        }
        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            for (size_t ii = 0; ii < vec.size() - 1; ii += 2) {
                val.emplace_back(vec[ii], vec[ii + 1]);
            }
            if (vec.size() % 2 == 1) {
                val.emplace_back(vec.back(), 0.0);
            }

            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            ValueConverter<std::vector<std::complex<double>>>::interpret(data, val);
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                val = helicsGetComplexVector(npval.name);
            } else {
                val.emplace_back(npval.value, 0.0);
            }
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val.push_back(cval);
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}